

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O2

void __thiscall
RecordManager::LoadAllRecordSet
          (RecordManager *this,vector<TableInfo,_std::allocator<TableInfo>_> *Ts)

{
  reference pvVar1;
  ulong __n;
  string filename;
  RecordSet NewRS;
  TableInfo T;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  RecordSet local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
  local_188;
  TableInfo local_108;
  
  for (__n = 0; __n < (ulong)(((long)(Ts->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>)
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(Ts->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>).
                                    _M_impl.super__Vector_impl_data._M_start) / 0xd8); __n = __n + 1
      ) {
    pvVar1 = std::vector<TableInfo,_std::allocator<TableInfo>_>::at(Ts,__n);
    TableInfo::TableInfo(&local_108,pvVar1);
    std::operator+(&local_188.first,&this->Direction,&local_108.tableName);
    std::operator+(&local_208,&local_188.first,"_rcd.dat");
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::string((string *)&local_228,(string *)&local_208);
    RecordSet::RecordSet(&local_1e8,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_RecordSet_&,_true>
              (&local_188,&local_208,&local_1e8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,RecordSet>,std::_Select1st<std::pair<std::__cxx11::string_const,RecordSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,RecordSet>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,RecordSet>,std::_Select1st<std::pair<std::__cxx11::string_const,RecordSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
                *)&this->Total_Record,&local_188);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
    ::~pair(&local_188);
    RecordSet::~RecordSet(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    TableInfo::~TableInfo(&local_108);
  }
  return;
}

Assistant:

void RecordManager::LoadAllRecordSet(vector<TableInfo> Ts) {
	int i;
	for (i = 0; i < Ts.size(); i++) {
		TableInfo T = Ts.at(i);
		string filename = Direction + T.tableName + "_rcd.dat";
		RecordSet NewRS = RecordSet(filename);
		this->Total_Record.insert(pair<string, RecordSet>(filename, NewRS));
	}
}